

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall cmFileCopier::SetPermissions(cmFileCopier *this,string *toFile,mode_t permissions)

{
  cmExecutionStatus *this_00;
  bool bVar1;
  ostream *poVar2;
  string local_1f8;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream e;
  Status local_2c;
  mode_t local_24;
  string *psStack_20;
  mode_t permissions_local;
  string *toFile_local;
  cmFileCopier *this_local;
  
  if (permissions != 0) {
    local_24 = permissions;
    psStack_20 = toFile;
    toFile_local = (string *)this;
    local_2c = cmsys::SystemTools::SetPermissions(toFile,permissions,false);
    bVar1 = cmsys::Status::operator_cast_to_bool(&local_2c);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar2 = std::operator<<((ostream *)local_1a8,this->Name);
      poVar2 = std::operator<<(poVar2," cannot set permissions on \"");
      poVar2 = std::operator<<(poVar2,(string *)psStack_20);
      poVar2 = std::operator<<(poVar2,"\": ");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      poVar2 = std::operator<<(poVar2,local_1d8);
      std::operator<<(poVar2,".");
      std::__cxx11::string::~string(local_1d8);
      this_00 = this->Status;
      std::__cxx11::ostringstream::str();
      cmExecutionStatus::SetError(this_00,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      goto LAB_007e2ac0;
    }
  }
  this_local._7_1_ = 1;
LAB_007e2ac0:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCopier::SetPermissions(const std::string& toFile,
                                  mode_t permissions)
{
  if (permissions) {
#ifdef _WIN32
    if (Makefile->IsOn("CMAKE_CROSSCOMPILING")) {
      // Store the mode in an NTFS alternate stream.
      std::string mode_t_adt_filename = toFile + ":cmake_mode_t";

      // Writing to an NTFS alternate stream changes the modification
      // time, so we need to save and restore its original value.
      cmFileTimes file_time_orig(toFile);
      {
        cmsys::ofstream permissionStream(mode_t_adt_filename.c_str());
        if (permissionStream) {
          permissionStream << std::oct << permissions << std::endl;
        }
        permissionStream.close();
      }
      file_time_orig.Store(toFile);
    }
#endif

    if (!cmSystemTools::SetPermissions(toFile, permissions)) {
      std::ostringstream e;
      e << this->Name << " cannot set permissions on \"" << toFile
        << "\": " << cmSystemTools::GetLastSystemError() << ".";
      this->Status.SetError(e.str());
      return false;
    }
  }
  return true;
}